

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  float *__p;
  char **ppcVar3;
  int iVar4;
  uint uVar5;
  FILE *__s;
  runtime_error *this;
  undefined8 uVar6;
  int i;
  Gamut gamut;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 in_XMM5_Qb;
  int res;
  int local_80;
  uint local_7c;
  float *out;
  float *scale;
  char **local_68;
  int nThreads;
  _Any_data local_58;
  code *pcStack_48;
  code *pcStack_40;
  
  if (argc < 3) {
    pcVar7 = 
    "Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\nwhere <gamut> is one of sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020"
    ;
  }
  else {
    gamut = SRGB;
    if (argc != 3) {
      pcVar7 = argv[3];
      iVar4 = strcasecmp(pcVar7,"sRGB");
      if (iVar4 != 0) {
        iVar4 = strcasecmp(pcVar7,"eRGB");
        if (iVar4 == 0) {
          gamut = ERGB;
        }
        else {
          iVar4 = strcasecmp(pcVar7,"XYZ");
          if (iVar4 == 0) {
            gamut = XYZ;
          }
          else {
            iVar4 = strcasecmp(pcVar7,"ProPhotoRGB");
            if (iVar4 == 0) {
              gamut = ProPhotoRGB;
            }
            else {
              iVar4 = strcasecmp(pcVar7,"ACES2065_1");
              if (iVar4 == 0) {
                gamut = ACES2065_1;
              }
              else {
                iVar4 = strcasecmp(pcVar7,"REC2020");
                if (iVar4 == 0) {
                  gamut = REC2020;
                }
                else {
                  iVar4 = strcasecmp(pcVar7,"DCI_P3");
                  if (iVar4 != 0) {
                    fprintf(_stderr,"Could not parse gamut `%s\'!\n",pcVar7);
                    goto LAB_001057ef;
                  }
                  gamut = DCI_P3;
                }
              }
            }
          }
        }
      }
    }
    init_tables(gamut);
    uVar5 = atoi(argv[1]);
    if (uVar5 != 0) {
      res = uVar5;
      nThreads = AvailableCores();
      std::make_unique<ThreadPool,int&>((int *)&scale);
      __p = scale;
      scale = (float *)0x0;
      std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,
                 (pointer)__p);
      std::unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_>::~unique_ptr
                ((unique_ptr<ThreadPool,_std::default_delete<ThreadPool>_> *)&scale);
      uVar8 = 0;
      local_68 = argv;
      printf("Optimizing %s spectra...\n",argv[3]);
      fflush(_stdout);
      uVar9 = (long)(int)uVar5 << 2;
      if ((int)uVar5 < 0) {
        uVar9 = 0xffffffffffffffff;
      }
      uVar11 = 0;
      if (0 < (int)uVar5) {
        uVar11 = (ulong)uVar5;
      }
      scale = (float *)operator_new__(uVar9);
      for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
        auVar12._0_8_ = (double)(int)uVar8 / (double)(int)(uVar5 - 1);
        auVar12._8_8_ = in_XMM5_Qb;
        auVar13 = vfmadd213sd_fma(auVar12,ZEXT816(0xc000000000000000),ZEXT816(0x4008000000000000));
        dVar1 = auVar12._0_8_ * auVar12._0_8_ * auVar13._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar1;
        auVar13 = vfmadd213sd_fma(auVar13,ZEXT816(0xc000000000000000),ZEXT816(0x4008000000000000));
        scale[uVar8] = (float)(dVar1 * dVar1 * auVar13._0_8_);
      }
      local_7c = uVar5 * uVar5 * uVar5 * 9;
      uVar9 = (long)(int)local_7c * 4;
      if ((int)local_7c < 0) {
        uVar9 = 0xffffffffffffffff;
      }
      out = (float *)operator_new__(uVar9);
      for (local_80 = 0; ppcVar3 = local_68, local_80 < 3; local_80 = local_80 + 1) {
        lVar10 = (long)res;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        pcStack_48 = (code *)0x0;
        pcStack_40 = (code *)0x0;
        local_58._M_unused._M_object = operator_new(0x20);
        *(int **)local_58._M_unused._0_8_ = &res;
        pcStack_40 = std::
                     _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/rgb2spec_opt.cpp:827:29)>
                     ::_M_invoke;
        pcStack_48 = std::
                     _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cmd/rgb2spec_opt.cpp:827:29)>
                     ::_M_manager;
        *(float ***)((long)local_58._M_unused._0_8_ + 8) = &scale;
        *(int **)((long)local_58._M_unused._0_8_ + 0x10) = &local_80;
        *(float ***)((long)local_58._M_unused._0_8_ + 0x18) = &out;
        ParallelFor(0,lVar10,(function<void_(long)> *)&local_58,(char *)0x0);
        std::_Function_base::~_Function_base((_Function_base *)&local_58);
      }
      __s = fopen(local_68[2],"w");
      if (__s == (FILE *)0x0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"Could not create file!");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fwrite("#include <pbrt/pbrt.h>\n",0x17,1,__s);
      fwrite("namespace pbrt {\n",0x11,1,__s);
      fprintf(__s,"extern PBRT_CONST int %sToSpectrumTable_Res = %d;\n",ppcVar3[3],(ulong)(uint)res)
      ;
      fprintf(__s,"extern PBRT_CONST float %sToSpectrumTable_Scale[%d] = {\n",ppcVar3[3],
              (ulong)(uint)res);
      for (lVar10 = 0; lVar10 < res; lVar10 = lVar10 + 1) {
        fprintf(__s,"%.9g, ",(double)scale[lVar10]);
      }
      fwrite("};\n",3,1,__s);
      uVar2 = local_7c;
      fprintf(__s,"extern PBRT_CONST float %sToSpectrumTable_Data[%d] = {\n",ppcVar3[3],
              (ulong)local_7c);
      uVar5 = 1;
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        uVar6 = 10;
        if ((uVar5 / 9) * 9 + 7 != (int)uVar9) {
          uVar6 = 0x20;
        }
        fprintf(__s,"%.9g,%c",(double)out[uVar9],uVar6);
        uVar5 = uVar5 + 1;
      }
      fwrite("};\n",3,1,__s);
      fwrite("} // namespace pbrt\n",0x14,1,__s);
      fclose(__s);
      std::__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_>::reset
                ((__uniq_ptr_impl<ThreadPool,_std::default_delete<ThreadPool>_> *)&threadPool,
                 (pointer)0x0);
      return 0;
    }
    pcVar7 = "Invalid resolution!";
    res = 0;
  }
  puts(pcVar7);
LAB_001057ef:
  exit(-1);
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 3) {
        printf("Syntax: rgb2spec_opt <resolution> <output> [<gamut>]\n"
               "where <gamut> is one of "
               "sRGB,eRGB,XYZ,ProPhotoRGB,ACES2065_1,REC2020\n");
        exit(-1);
    }
    Gamut gamut = SRGB;
    if (argc > 3)
        gamut = parse_gamut(argv[3]);
    if (gamut == NO_GAMUT) {
        fprintf(stderr, "Could not parse gamut `%s'!\n", argv[3]);
        exit(-1);
    }
    init_tables(gamut);

    const int res = atoi(argv[1]);
    if (res == 0) {
        printf("Invalid resolution!\n");
        exit(-1);
    }

    int nThreads = AvailableCores();
    threadPool = std::make_unique<ThreadPool>(nThreads);

    printf("Optimizing %s spectra...\n", argv[3]);
    fflush(stdout);

    float *scale = new float[res];
    for (int k = 0; k < res; ++k)
        scale[k] = (float)smoothstep(smoothstep(k / double(res - 1)));

    size_t bufsize = 3 * 3 * res * res * res;
    float *out = new float[bufsize];

    for (int l = 0; l < 3; ++l) {
        ParallelFor(0, res, [&](size_t j) {
            const double y = j / double(res - 1);
            fflush(stdout);
            for (int i = 0; i < res; ++i) {
                const double x = i / double(res - 1);
                double coeffs[3], rgb[3];
                memset(coeffs, 0, sizeof(double) * 3);

                int start = res / 5;

                for (int k = start; k < res; ++k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    double resid = gauss_newton(rgb, coeffs);
                    (void)resid;

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }

                memset(coeffs, 0, sizeof(double) * 3);
                for (int k = start; k >= 0; --k) {
                    double b = (double)scale[k];

                    rgb[l] = b;
                    rgb[(l + 1) % 3] = x * b;
                    rgb[(l + 2) % 3] = y * b;

                    double resid = gauss_newton(rgb, coeffs);
                    (void)resid;

                    double c0 = 360.0, c1 = 1.0 / (830.0 - 360.0);
                    double A = coeffs[0], B = coeffs[1], C = coeffs[2];

                    int idx = ((l * res + k) * res + j) * res + i;

                    out[3 * idx + 0] = float(A * (sqr(c1)));
                    out[3 * idx + 1] = float(B * c1 - 2 * A * c0 * (sqr(c1)));
                    out[3 * idx + 2] = float(C - B * c0 * c1 + A * (sqr(c0 * c1)));
                    // out[3*idx + 2] = resid;
                }
            }
        });
    }

    FILE *f = fopen(argv[2], "w");
    if (f == nullptr)
        throw std::runtime_error("Could not create file!");
    fprintf(f, "#include <pbrt/pbrt.h>\n");
    fprintf(f, "namespace pbrt {\n");
    fprintf(f, "extern PBRT_CONST int %sToSpectrumTable_Res = %d;\n", argv[3], res);
    fprintf(f, "extern PBRT_CONST float %sToSpectrumTable_Scale[%d] = {\n", argv[3], res);
    for (int i = 0; i < res; ++i)
        fprintf(f, "%.9g, ", scale[i]);
    fprintf(f, "};\n");
    fprintf(f, "extern PBRT_CONST float %sToSpectrumTable_Data[%d] = {\n", argv[3],
            (int)bufsize);
    for (int i = 0; i < bufsize; ++i)
        fprintf(f, "%.9g,%c", out[i], ((i + 1) % 9) == 8 ? '\n' : ' ');
    fprintf(f, "};\n");
    fprintf(f, "} // namespace pbrt\n");
    fclose(f);

    threadPool.reset();
}